

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

CURLcode cf_tcp_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  _Bool _Var4;
  uint uVar5;
  CURLcode CVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  socklen_t __len;
  char *pcVar10;
  curltime cVar11;
  char buffer [256];
  
  if ((cf->field_0x24 & 1) == 0) {
    if (blocking) {
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    pvVar2 = cf->ctx;
    *done = false;
    iVar7 = *(int *)((long)pvVar2 + 0x98);
    if (iVar7 == -1) {
      CVar6 = cf_socket_open(cf,data);
      if (CVar6 == CURLE_OK) {
        if ((cf->field_0x24 & 1) != 0) goto LAB_00530733;
        pvVar3 = cf->ctx;
        buffer[0] = '\x01';
        buffer[1] = '\0';
        buffer[2] = '\0';
        buffer[3] = '\0';
        iVar7 = *(int *)((long)pvVar3 + 0x98);
        if (((uint)cf->conn->bits >> 0x18 & 1) == 0) {
          __len = *(socklen_t *)((long)pvVar3 + 0x14);
        }
        else {
          iVar7 = setsockopt(iVar7,6,0x1e,buffer,4);
          if (((data != (Curl_easy *)0x0) && (iVar7 < 0)) && (((data->set).field_0x8bd & 0x10) != 0)
             ) {
            Curl_infof(data,"Failed to enable TCP Fast Open on fd %d",
                       (ulong)*(uint *)((long)pvVar3 + 0x98));
          }
          __len = *(socklen_t *)((long)pvVar3 + 0x14);
          iVar7 = *(int *)((long)pvVar3 + 0x98);
        }
        iVar8 = connect(iVar7,(sockaddr *)((long)pvVar3 + 0x18),__len);
        piVar9 = __errno_location();
        iVar7 = *piVar9;
        set_local_ip(cf,data);
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
           (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"local address %s port %d...",(long)pvVar2 + 0x114,
                            (ulong)*(uint *)((long)pvVar2 + 0x144));
        }
        if (iVar8 != -1) {
          iVar7 = *(curl_socket_t *)((long)pvVar2 + 0x98);
          CVar6 = CURLE_OK;
          goto LAB_005306a5;
        }
        CVar6 = socket_connect_result(data,(char *)((long)pvVar2 + 0xe0),iVar7);
        goto LAB_005308cc;
      }
    }
    else {
      CVar6 = CURLE_COULDNT_CONNECT;
LAB_005306a5:
      uVar5 = Curl_socket_check(-1,-1,iVar7,0);
      if (uVar5 != 2) {
        if (uVar5 == 0) {
          if (data == (Curl_easy *)0x0) {
            return CURLE_OK;
          }
          if (((data->set).field_0x8bd & 0x10) == 0) {
            return CURLE_OK;
          }
          if (cf->cft->log_level < 1) {
            return CURLE_OK;
          }
          pcVar10 = "not connected yet";
          goto LAB_005307eb;
        }
        if (((cf->conn->bits).field_0x3 & 1) == 0) {
          if ((uVar5 & 4) == 0) goto LAB_005308cc;
          verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x178));
          CVar6 = CURLE_COULDNT_CONNECT;
          goto LAB_005308d4;
        }
      }
      _Var4 = verifyconnect(*(curl_socket_t *)((long)pvVar2 + 0x98),(int *)((long)pvVar2 + 0x178));
      if (_Var4) {
        cVar11 = Curl_now();
        *(time_t *)((long)pvVar2 + 0x158) = cVar11.tv_sec;
        *(int *)((long)pvVar2 + 0x160) = cVar11.tv_usec;
        set_local_ip(cf,data);
        *done = true;
        cf->field_0x24 = cf->field_0x24 | 1;
        if (data == (Curl_easy *)0x0) {
          return CURLE_OK;
        }
        if (((data->set).field_0x8bd & 0x10) == 0) {
          return CURLE_OK;
        }
        if (cf->cft->log_level < 1) {
          return CURLE_OK;
        }
        pcVar10 = "connected";
LAB_005307eb:
        Curl_trc_cf_infof(data,cf,pcVar10);
        return CURLE_OK;
      }
LAB_005308cc:
      if (CVar6 == CURLE_OK) goto LAB_00530737;
    }
LAB_005308d4:
    if (*(int *)((long)pvVar2 + 0x178) != 0) {
      set_local_ip(cf,data);
      iVar7 = *(int *)((long)pvVar2 + 0x178);
      (data->state).os_errno = iVar7;
      piVar9 = __errno_location();
      *piVar9 = iVar7;
      if (((data->set).field_0x8bd & 0x10) != 0) {
        uVar5 = *(uint *)((long)pvVar2 + 0x110);
        uVar1 = *(uint *)((long)pvVar2 + 0x144);
        pcVar10 = Curl_strerror(iVar7,buffer,0x100);
        Curl_infof(data,"connect to %s port %u from %s port %d failed: %s",(long)pvVar2 + 0xe0,
                   (ulong)uVar5,(long)pvVar2 + 0x114,(ulong)uVar1,pcVar10);
      }
    }
    if (*(int *)((long)pvVar2 + 0x98) != -1) {
      socket_close(data,cf->conn,1,*(int *)((long)pvVar2 + 0x98));
      *(undefined4 *)((long)pvVar2 + 0x98) = 0xffffffff;
    }
    *done = false;
  }
  else {
LAB_00530733:
    *done = true;
LAB_00530737:
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

static CURLcode cf_tcp_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_COULDNT_CONNECT;
  int rc = 0;

  (void)data;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* TODO: need to support blocking connect? */
  if(blocking)
    return CURLE_UNSUPPORTED_PROTOCOL;

  *done = FALSE; /* a very negative world view is best */
  if(ctx->sock == CURL_SOCKET_BAD) {
    int error;

    result = cf_socket_open(cf, data);
    if(result)
      goto out;

    if(cf->connected) {
      *done = TRUE;
      return CURLE_OK;
    }

    /* Connect TCP socket */
    rc = do_connect(cf, data, cf->conn->bits.tcp_fastopen);
    error = SOCKERRNO;
    set_local_ip(cf, data);
    CURL_TRC_CF(data, cf, "local address %s port %d...",
                ctx->l_ip, ctx->l_port);
    if(-1 == rc) {
      result = socket_connect_result(data, ctx->r_ip, error);
      goto out;
    }
  }

#ifdef mpeix
  /* Call this function once now, and ignore the results. We do this to
     "clear" the error state on the socket so that we can later read it
     reliably. This is reported necessary on the MPE/iX operating
     system. */
  (void)verifyconnect(ctx->sock, NULL);
#endif
  /* check socket for connect */
  rc = SOCKET_WRITABLE(ctx->sock, 0);

  if(rc == 0) { /* no connection yet */
    CURL_TRC_CF(data, cf, "not connected yet");
    return CURLE_OK;
  }
  else if(rc == CURL_CSELECT_OUT || cf->conn->bits.tcp_fastopen) {
    if(verifyconnect(ctx->sock, &ctx->error)) {
      /* we are connected with TCP, awesome! */
      ctx->connected_at = Curl_now();
      set_local_ip(cf, data);
      *done = TRUE;
      cf->connected = TRUE;
      CURL_TRC_CF(data, cf, "connected");
      return CURLE_OK;
    }
  }
  else if(rc & CURL_CSELECT_ERR) {
    (void)verifyconnect(ctx->sock, &ctx->error);
    result = CURLE_COULDNT_CONNECT;
  }

out:
  if(result) {
    if(ctx->error) {
      set_local_ip(cf, data);
      data->state.os_errno = ctx->error;
      SET_SOCKERRNO(ctx->error);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      {
        char buffer[STRERROR_LEN];
        infof(data, "connect to %s port %u from %s port %d failed: %s",
              ctx->r_ip, ctx->r_port, ctx->l_ip, ctx->l_port,
              Curl_strerror(ctx->error, buffer, sizeof(buffer)));
      }
#endif
    }
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
    *done = FALSE;
  }
  return result;
}